

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
pstore::serialize::read<std::__cxx11::string,pstore::serialize::archive::database_reader>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,serialize *this,database_reader *archive)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
  d;
  type uninit_buffer;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
  local_40;
  _Alloc_hider local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  flood<pstore::serialize::details::aligned_storage<32ul,8ul>::type>((type *)&local_38);
  serializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::read<pstore::serialize::archive::database_reader>
            ((database_reader *)this,(value_type *)&local_38);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_p == &local_28) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_28._M_allocated_capacity._1_7_,local_28._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_28._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_38._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_28._M_allocated_capacity._1_7_,local_28._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_30;
  local_30 = 0;
  local_28._M_local_buf[0] = '\0';
  local_40._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
        )(tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
          )&local_38;
  local_38._M_p = (pointer)&local_28;
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/types.hpp:422:25)>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_serialize_types_hpp:422:25)>
                 *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

Ty read (Archive && archive) {
            using T2 = typename std::remove_const<Ty>::type;
            typename details::aligned_storage<sizeof (T2), alignof (T2)>::type uninit_buffer;
            flood (&uninit_buffer);

            // Deserialize into the uninitialized buffer.
            auto & t2 = reinterpret_cast<T2 &> (uninit_buffer);
            read_uninit (std::forward<Archive> (archive), t2);

            // This object will destroy the remains of the T2 instance in uninit_buffer.
            auto dtor = [] (T2 * p) { p->~T2 (); };
            std::unique_ptr<T2, decltype (dtor)> d (&t2, dtor);
            return std::move (t2);
        }